

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GlobalObject.cpp
# Opt level: O0

Var Js::GlobalObject::EntryTelemetryLog(RecyclableObject *function,CallInfo callInfo,...)

{
  code *pcVar1;
  bool bVar2;
  int iVar3;
  BOOL BVar4;
  ScriptContext *pSVar5;
  ThreadContext *pTVar6;
  Var *values;
  undefined4 *puVar7;
  Var pvVar8;
  JavascriptString *infoStringJs;
  JavascriptBoolean *this;
  undefined4 extraout_var;
  PAL_FILE *stream;
  JavascriptLibrary *this_00;
  RecyclableObject *pRVar9;
  bool local_61;
  bool doPrint;
  JavascriptString *jsString;
  ArgumentReader args;
  Var *_argsVarArray;
  RecyclableObject *function_local;
  CallInfo callInfo_local;
  
  function_local = (RecyclableObject *)callInfo;
  pSVar5 = RecyclableObject::GetScriptContext(function);
  pTVar6 = ScriptContext::GetThreadContext(pSVar5);
  pSVar5 = RecyclableObject::GetScriptContext(function);
  ThreadContext::ProbeStack(pTVar6,0xc00,pSVar5,(PVOID)0x0);
  iVar3 = _count_args((CallInfo)function_local);
  values = _get_va(&stack0x00000000,iVar3);
  args.super_Arguments.Values = (Type)function_local;
  bVar2 = CallInfo::operator==((CallInfo *)(values + -1),(CallInfo)function_local);
  if (!bVar2) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar7 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/GlobalObject.cpp"
                                ,0x639,
                                "(*reinterpret_cast<Js::CallInfo*>(_argsVarArray - 1) == callInfo)",
                                "*reinterpret_cast<Js::CallInfo*>(_argsVarArray - 1) == callInfo");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar7 = 0;
  }
  ArgumentReader::ArgumentReader((ArgumentReader *)&jsString,(CallInfo *)&function_local,values);
  if (1 < ((uint)jsString & 0xffffff)) {
    pvVar8 = Arguments::operator[]((Arguments *)&jsString,1);
    bVar2 = VarIs<Js::JavascriptString>(pvVar8);
    if (bVar2) {
      pvVar8 = Arguments::operator[]((Arguments *)&jsString,1);
      infoStringJs = VarTo<Js::JavascriptString>(pvVar8);
      local_61 = false;
      if (((uint)jsString & 0xffffff) == 3) {
        pvVar8 = Arguments::operator[]((Arguments *)&jsString,2);
        bVar2 = VarIs<Js::JavascriptBoolean>(pvVar8);
        local_61 = false;
        if (bVar2) {
          pvVar8 = Arguments::operator[]((Arguments *)&jsString,2);
          this = VarTo<Js::JavascriptBoolean>(pvVar8);
          BVar4 = JavascriptBoolean::GetValue(this);
          local_61 = BVar4 != 0;
        }
      }
      pSVar5 = RecyclableObject::GetScriptContext(function);
      bVar2 = ScriptContext::ShouldPerformReplayAction(pSVar5);
      if (bVar2) {
        pSVar5 = RecyclableObject::GetScriptContext(function);
        pTVar6 = ScriptContext::GetThreadContext(pSVar5);
        TTD::EventLog::ReplayTelemetryLogEvent(pTVar6->TTDLog,infoStringJs);
      }
      pSVar5 = RecyclableObject::GetScriptContext(function);
      bVar2 = ScriptContext::ShouldPerformRecordAction(pSVar5);
      if (bVar2) {
        pSVar5 = RecyclableObject::GetScriptContext(function);
        pTVar6 = ScriptContext::GetThreadContext(pSVar5);
        TTD::EventLog::RecordTelemetryLogEvent(pTVar6->TTDLog,infoStringJs,local_61);
      }
      if (local_61 != false) {
        iVar3 = (*(infoStringJs->super_RecyclableObject).super_FinalizableObject.
                  super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject[0x65])();
        Output::Print(L"%ls\n",CONCAT44(extraout_var,iVar3));
        stream = PAL_get_stdout(0);
        PAL_fflush(stream);
      }
      pSVar5 = RecyclableObject::GetScriptContext(function);
      this_00 = ScriptContext::GetLibrary(pSVar5);
      pRVar9 = JavascriptLibraryBase::GetUndefined(&this_00->super_JavascriptLibraryBase);
      return pRVar9;
    }
  }
  TTDAbort_unrecoverable_error("Bad arguments!!!");
}

Assistant:

Var GlobalObject::EntryTelemetryLog(RecyclableObject* function, CallInfo callInfo, ...)
    {
        PROBE_STACK(function->GetScriptContext(), Js::Constants::MinStackDefault);
        ARGUMENTS(args, callInfo);

        TTDAssert(args.Info.Count >= 2 && Js::VarIs<Js::JavascriptString>(args[1]), "Bad arguments!!!");

        Js::JavascriptString* jsString = Js::VarTo<Js::JavascriptString>(args[1]);
        bool doPrint = (args.Info.Count == 3) && Js::VarIs<Js::JavascriptBoolean>(args[2]) && (Js::VarTo<Js::JavascriptBoolean>(args[2])->GetValue());

        if(function->GetScriptContext()->ShouldPerformReplayAction())
        {
            function->GetScriptContext()->GetThreadContext()->TTDLog->ReplayTelemetryLogEvent(jsString);
        }

        if(function->GetScriptContext()->ShouldPerformRecordAction())
        {
            function->GetScriptContext()->GetThreadContext()->TTDLog->RecordTelemetryLogEvent(jsString, doPrint);
        }

        if(doPrint)
        {
            //
            //TODO: the host should give us a print callback which we can use here
            //
            Output::Print(_u("%ls\n"), jsString->GetSz());
            fflush(stdout);
        }

        return function->GetScriptContext()->GetLibrary()->GetUndefined();
    }